

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O2

bool __thiscall ON_NurbsCage::GetCV(ON_NurbsCage *this,int i,int j,int k,ON_4dPoint *point)

{
  int iVar1;
  double *pdVar2;
  double dVar3;
  
  pdVar2 = CV(this,i,j,k);
  if (pdVar2 != (double *)0x0) {
    point->x = *pdVar2;
    iVar1 = this->m_dim;
    if ((long)iVar1 < 2) {
      point->y = 0.0;
      dVar3 = 0.0;
    }
    else {
      point->y = pdVar2[1];
      dVar3 = 0.0;
      if (iVar1 != 2) {
        dVar3 = pdVar2[2];
      }
    }
    point->z = dVar3;
    if (this->m_is_rat == true) {
      dVar3 = pdVar2[iVar1];
    }
    else {
      dVar3 = 1.0;
    }
    point->w = dVar3;
  }
  return pdVar2 != (double *)0x0;
}

Assistant:

bool ON_NurbsCage::GetCV( int i, int j, int k, ON_4dPoint& point ) const
{
  bool rc = false;
  const double* cv = CV(i,j,k);
  if ( cv ) {
    point.x = cv[0];
    point.y = (m_dim>1)? cv[1] : 0.0;
    point.z = (m_dim>2)? cv[2] : 0.0;
    point.w = (m_is_rat) ? cv[m_dim] : 1.0;
    rc = true;
  }
  return rc;
}